

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_local_statement(Proc *proc,AstNode *stmt)

{
  LuaSymbolList *head;
  AstNodeList *expr_list;
  int nv_00;
  node_info *varinfo_00;
  long lVar1;
  VariableType *pVStack_60;
  undefined1 local_58 [8];
  Pseudo *var_pseudo;
  PtrListIterator symiter__;
  int i;
  node_info *varinfo;
  void *pvStack_20;
  int nv;
  LuaSymbol *sym;
  AstNode *stmt_local;
  Proc *proc_local;
  
  pVStack_60 = (VariableType *)0x12221d;
  nv_00 = raviX_ptrlist_size((PtrList *)(stmt->field_2).local_stmt.var_list);
  lVar1 = (long)nv_00;
  varinfo_00 = (node_info *)(local_58 + lVar1 * -0x10);
  symiter__._20_4_ = 0;
  head = (stmt->field_2).local_stmt.var_list;
  (&pVStack_60)[lVar1 * -2] = (VariableType *)0x12224d;
  raviX_ptrlist_forward_iterator((PtrListIterator *)&var_pseudo,(PtrList *)head);
  (&pVStack_60)[lVar1 * -2] = (VariableType *)0x122256;
  pvStack_20 = raviX_ptrlist_iter_next((PtrListIterator *)&var_pseudo);
  while( true ) {
    if (pvStack_20 == (void *)0x0) {
      expr_list = (stmt->field_2).local_stmt.expr_list;
      (&pVStack_60)[lVar1 * -2] = (VariableType *)0x1222fd;
      linearize_assignment(proc,expr_list,varinfo_00,nv_00);
      return;
    }
    local_58 = *(undefined1 (*) [8])((long)pvStack_20 + 0x38);
    if (local_58 == (undefined1  [8])0x0) break;
    varinfo_00[(int)symiter__._20_4_].vartype = (VariableType *)((long)pvStack_20 + 8);
    varinfo_00[(int)symiter__._20_4_].pseudo = (Pseudo *)local_58;
    symiter__._20_4_ = symiter__._20_4_ + 1;
    (&pVStack_60)[lVar1 * -2] = (VariableType *)0x1222dc;
    pvStack_20 = raviX_ptrlist_iter_next((PtrListIterator *)&var_pseudo);
  }
  (&pVStack_60)[lVar1 * -2] = (VariableType *)0x122299;
  __assert_fail("var_pseudo",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x79c,"void linearize_local_statement(Proc *, AstNode *)");
}

Assistant:

static void linearize_local_statement(Proc *proc, AstNode *stmt)
{
	LuaSymbol *sym;

	int nv = raviX_ptrlist_size((const PtrList *)stmt->local_stmt.var_list);
	struct node_info *varinfo = (struct node_info *)alloca(nv * sizeof(struct node_info));
	int i = 0;

	FOR_EACH_PTR(stmt->local_stmt.var_list, LuaSymbol, sym)
	{
		Pseudo *var_pseudo = sym->variable.pseudo;
		assert(var_pseudo);
		varinfo[i].vartype = &sym->variable.value_type;
		varinfo[i].pseudo = var_pseudo;
		i++;
	}
	END_FOR_EACH_PTR(var)

	linearize_assignment(proc, stmt->local_stmt.expr_list, varinfo, nv);
}